

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O3

void bug(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [1000];
  undefined8 local_4c8;
  void **local_4c0;
  undefined1 *local_4b8;
  undefined1 local_4a8 [8];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  undefined8 local_408;
  char local_3f8 [1008];
  
  local_4b8 = local_4a8;
  if (in_AL != '\0') {
    local_478 = in_XMM0_Qa;
    local_468 = in_XMM1_Qa;
    local_458 = in_XMM2_Qa;
    local_448 = in_XMM3_Qa;
    local_438 = in_XMM4_Qa;
    local_428 = in_XMM5_Qa;
    local_418 = in_XMM6_Qa;
    local_408 = in_XMM7_Qa;
  }
  local_4c0 = &ap[0].overflow_arg_area;
  local_4c8 = 0x3000000008;
  local_4a0 = in_RSI;
  local_498 = in_RDX;
  local_490 = in_RCX;
  local_488 = in_R8;
  local_480 = in_R9;
  vsnprintf(local_3f8,999,fmt,&local_4c8);
  pd_error((void *)0x0,"consistency check failed: %s",local_3f8);
  return;
}

Assistant:

void bug(const char *fmt, ...)
{
    char buf[MAXPDSTRING];
    va_list ap;
    t_int arg[8];
    int i;
    va_start(ap, fmt);
    vsnprintf(buf, MAXPDSTRING-1, fmt, ap);
    va_end(ap);

    pd_error(0, "consistency check failed: %s", buf);
}